

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.h
# Opt level: O3

void __thiscall
__gnu_cxx::new_allocator<Assimp::AC3DImporter::Object>::
construct<Assimp::AC3DImporter::Object,Assimp::AC3DImporter::Object>
          (new_allocator<Assimp::AC3DImporter::Object> *this,Object *__p,Object *__args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  aiVector2D aVar5;
  aiVector2D aVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  uint uVar17;
  
  __p->type = __args->type;
  paVar1 = &(__p->name).field_2;
  (__p->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->name)._M_dataplus._M_p;
  paVar2 = &(__args->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->name).field_2 + 8) = uVar4;
  }
  else {
    (__p->name)._M_dataplus._M_p = pcVar3;
    (__p->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->name)._M_string_length = (__args->name)._M_string_length;
  (__args->name)._M_dataplus._M_p = (pointer)paVar2;
  (__args->name)._M_string_length = 0;
  (__args->name).field_2._M_local_buf[0] = '\0';
  (__p->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (__args->children).
       super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__p->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (__args->children).
       super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__p->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (__args->children).
       super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  paVar1 = &(__p->texture).field_2;
  (__p->texture)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->texture)._M_dataplus._M_p;
  paVar2 = &(__args->texture).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->texture).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->texture).field_2 + 8) = uVar4;
  }
  else {
    (__p->texture)._M_dataplus._M_p = pcVar3;
    (__p->texture).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->texture)._M_string_length = (__args->texture)._M_string_length;
  (__args->texture)._M_dataplus._M_p = (pointer)paVar2;
  (__args->texture)._M_string_length = 0;
  (__args->texture).field_2._M_local_buf[0] = '\0';
  aVar5 = __args->texRepeat;
  aVar6 = __args->texOffset;
  fVar13 = (__args->rotation).a1;
  fVar14 = (__args->rotation).a2;
  fVar15 = (__args->rotation).a3;
  fVar16 = (__args->rotation).b1;
  fVar9 = (__args->rotation).b2;
  fVar10 = (__args->rotation).b3;
  fVar11 = (__args->rotation).c1;
  fVar12 = (__args->rotation).c2;
  fVar7 = (__args->translation).y;
  fVar8 = (__args->translation).z;
  *(undefined8 *)&(__p->rotation).c3 = *(undefined8 *)&(__args->rotation).c3;
  (__p->translation).y = fVar7;
  (__p->translation).z = fVar8;
  (__p->rotation).b2 = fVar9;
  (__p->rotation).b3 = fVar10;
  (__p->rotation).c1 = fVar11;
  (__p->rotation).c2 = fVar12;
  (__p->rotation).a1 = fVar13;
  (__p->rotation).a2 = fVar14;
  (__p->rotation).a3 = fVar15;
  (__p->rotation).b1 = fVar16;
  __p->texRepeat = aVar5;
  __p->texOffset = aVar6;
  (__p->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (__args->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__p->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_finish =
       (__args->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__p->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (__args->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->vertices).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->surfaces).
  super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (__args->surfaces).
       super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__p->surfaces).
  super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (__args->surfaces).
       super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__p->surfaces).
  super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (__args->surfaces).
       super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->surfaces).
  super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->surfaces).
  super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->surfaces).
  super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __p->crease = __args->crease;
  uVar17 = __args->subDiv;
  __p->numRefs = __args->numRefs;
  __p->subDiv = uVar17;
  return;
}

Assistant:

Object()
            :   type    (World)
            ,   name( "" )
            ,   children()
            ,   texture( "" )
            ,   texRepeat( 1.f, 1.f )
            ,   texOffset( 0.0f, 0.0f )
            ,   rotation()
            ,   translation()
            ,   vertices()
            ,   surfaces()
            ,   numRefs (0)
            ,   subDiv  (0)
            ,   crease()
        {}